

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O2

aiReturn aiGetMaterialString(aiMaterial *pMat,char *pKey,uint type,uint index,aiString *pOut)

{
  ai_uint32 aVar1;
  Logger *this;
  aiReturn aVar2;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  aiMaterialProperty *prop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (pOut == (aiString *)0x0) {
    __assert_fail("pOut != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Material/MaterialSystem.cpp"
                  ,0x127,
                  "aiReturn aiGetMaterialString(const aiMaterial *, const char *, unsigned int, unsigned int, aiString *)"
                 );
  }
  aiGetMaterialProperty(pMat,pKey,type,index,&prop);
  aVar2 = aiReturn_FAILURE;
  if (prop != (aiMaterialProperty *)0x0) {
    if (prop->mType == aiPTI_String) {
      if (prop->mDataLength < 5) {
        __assert_fail("prop->mDataLength>=5",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Material/MaterialSystem.cpp"
                      ,0x130,
                      "aiReturn aiGetMaterialString(const aiMaterial *, const char *, unsigned int, unsigned int, aiString *)"
                     );
      }
      aVar1 = *(ai_uint32 *)prop->mData;
      pOut->length = aVar1;
      if (aVar1 + 5 != prop->mDataLength) {
        __assert_fail("pOut->length+1+4==prop->mDataLength",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Material/MaterialSystem.cpp"
                      ,0x135,
                      "aiReturn aiGetMaterialString(const aiMaterial *, const char *, unsigned int, unsigned int, aiString *)"
                     );
      }
      if (prop->mData[aVar1 + 4] != '\0') {
        __assert_fail("!prop->mData[ prop->mDataLength - 1 ]",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Material/MaterialSystem.cpp"
                      ,0x136,
                      "aiReturn aiGetMaterialString(const aiMaterial *, const char *, unsigned int, unsigned int, aiString *)"
                     );
      }
      memcpy(pOut->data,prop->mData + 4,(ulong)(aVar1 + 1));
      aVar2 = aiReturn_SUCCESS;
    }
    else {
      this = Assimp::DefaultLogger::get();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pKey,&local_89);
      std::operator+(&local_88,"Material property",&local_40);
      std::operator+(&local_68,&local_88," was found, but is no string");
      Assimp::Logger::error(this,local_68._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return aVar2;
}

Assistant:

aiReturn aiGetMaterialString(const aiMaterial* pMat,
    const char* pKey,
    unsigned int type,
    unsigned int index,
    aiString* pOut)
{
    ai_assert (pOut != NULL);

    const aiMaterialProperty* prop;
    aiGetMaterialProperty(pMat,pKey,type,index,(const aiMaterialProperty**)&prop);
    if (!prop) {
        return AI_FAILURE;
    }

    if( aiPTI_String == prop->mType) {
        ai_assert(prop->mDataLength>=5);

        // The string is stored as 32 but length prefix followed by zero-terminated UTF8 data
        pOut->length = static_cast<unsigned int>(*reinterpret_cast<uint32_t*>(prop->mData));

        ai_assert( pOut->length+1+4==prop->mDataLength );
        ai_assert( !prop->mData[ prop->mDataLength - 1 ] );
        memcpy(pOut->data,prop->mData+4,pOut->length+1);
    }
    else {
        // TODO - implement lexical cast as well
        ASSIMP_LOG_ERROR("Material property" + std::string(pKey) +
            " was found, but is no string" );
        return AI_FAILURE;
    }
    return AI_SUCCESS;
}